

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall
ON_NurbsSurface::ConvertSpanToBezier
          (ON_NurbsSurface *this,int span_index0,int span_index1,ON_BezierSurface *bezier_surface)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  int iVar8;
  bool bVar9;
  ON_NurbsSurface bispan;
  ON_NurbsSurface local_88;
  
  if (((this->m_cv != (double *)0x0) && (pdVar7 = this->m_knot[0], pdVar7 != (double *)0x0)) &&
     (pdVar5 = this->m_knot[1], -1 < span_index0 && pdVar5 != (double *)0x0)) {
    if (span_index1 < 0) {
      return false;
    }
    if (this->m_cv_count[0] - this->m_order[0] < span_index0) {
      return false;
    }
    if (((span_index1 <= this->m_cv_count[1] - this->m_order[1]) &&
        (lVar6 = (long)(this->m_order[0] + span_index0), pdVar7[lVar6 + -2] < pdVar7[lVar6 + -1]))
       && (lVar6 = (long)(this->m_order[1] + span_index1), pdVar5[lVar6 + -2] < pdVar5[lVar6 + -1]))
    {
      ON_NurbsSurface(&local_88);
      local_88.m_cv = bezier_surface->m_cv;
      local_88.m_cv_capacity = bezier_surface->m_cv_capacity;
      Create(&local_88,this->m_dim,this->m_is_rat != 0,this->m_order[0],this->m_order[1],
             this->m_order[0],this->m_order[1]);
      iVar8 = this->m_order[0];
      if (0 < iVar8) {
        iVar1 = this->m_dim;
        iVar2 = this->m_is_rat;
        iVar4 = 0;
        do {
          if (0 < this->m_order[1]) {
            iVar8 = 0;
            do {
              uVar3 = local_88.m_cv_stride[1] * iVar8 + local_88.m_cv_stride[0] * iVar4;
              pdVar7 = local_88.m_cv + uVar3;
              if ((int)uVar3 < 0) {
                pdVar7 = (double *)0x0;
              }
              if (local_88.m_cv == (double *)0x0) {
                pdVar7 = (double *)0x0;
              }
              uVar3 = (span_index1 + iVar8) * this->m_cv_stride[1] +
                      this->m_cv_stride[0] * (iVar4 + span_index0);
              pdVar5 = this->m_cv + uVar3;
              if ((int)uVar3 < 0) {
                pdVar5 = (double *)0x0;
              }
              if (this->m_cv == (double *)0x0) {
                pdVar5 = (double *)0x0;
              }
              memcpy(pdVar7,pdVar5,(long)(int)(((iVar1 + 1) - (uint)(iVar2 == 0)) * 8));
              iVar8 = iVar8 + 1;
            } while (iVar8 < this->m_order[1]);
          }
          iVar4 = iVar4 + 1;
          iVar8 = this->m_order[0];
        } while (iVar4 < iVar8);
      }
      pdVar7 = this->m_knot[0];
      pdVar5 = this->m_knot[1];
      lVar6 = (long)(this->m_order[1] + span_index1);
      if ((pdVar5[(uint)span_index1] != pdVar5[lVar6 + -2]) ||
         (NAN(pdVar5[(uint)span_index1]) || NAN(pdVar5[lVar6 + -2]))) {
        bVar9 = true;
      }
      else {
        bVar9 = pdVar7[(long)(iVar8 + span_index0) + -2] != pdVar7[(uint)span_index0] ||
                pdVar7[(long)(iVar8 + span_index0) + -1] !=
                pdVar7[(long)(span_index0 + iVar8 * 2) + -3];
      }
      if (((pdVar5[lVar6 + -1] != pdVar5[(long)(span_index1 + this->m_order[1] * 2) + -3]) ||
          (NAN(pdVar5[lVar6 + -1]) || NAN(pdVar5[(long)(span_index1 + this->m_order[1] * 2) + -3])))
         || (bVar9)) {
        iVar8 = ON_KnotCount(local_88.m_order[0],local_88.m_cv_count[0]);
        memcpy(local_88.m_knot[0],pdVar7 + (uint)span_index0,(long)iVar8 << 3);
        pdVar7 = this->m_knot[1];
        iVar8 = ON_KnotCount(local_88.m_order[1],local_88.m_cv_count[1]);
        memcpy(local_88.m_knot[1],pdVar7 + (uint)span_index1,(long)iVar8 << 3);
        ClampEnd(&local_88,1,2);
        ClampEnd(&local_88,0,2);
      }
      bezier_surface->m_dim = local_88.m_dim;
      bezier_surface->m_is_rat = local_88.m_is_rat;
      bezier_surface->m_order[0] = local_88.m_order[0];
      bezier_surface->m_order[1] = local_88.m_order[1];
      bezier_surface->m_cv_stride[0] = local_88.m_cv_stride[0];
      bezier_surface->m_cv_stride[1] = local_88.m_cv_stride[1];
      bezier_surface->m_cv = local_88.m_cv;
      bezier_surface->m_cv_capacity = local_88.m_cv_capacity;
      local_88.m_cv = (double *)0x0;
      local_88.m_cv_capacity = 0;
      ~ON_NurbsSurface(&local_88);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_NurbsSurface::ConvertSpanToBezier(
    int span_index0,
    int span_index1, 
    ON_BezierSurface& bezier_surface
    ) const
{
  int i, j;
  if ( !m_cv || !m_knot[0] || !m_knot[1] )
    return false;
  if ( span_index0 < 0 ||  span_index0 > m_cv_count[0]-m_order[0] )
    return false;
  if ( span_index1 < 0 ||  span_index1 > m_cv_count[1]-m_order[1] )
    return false;
  i = span_index0+m_order[0]-2;
  if ( m_knot[0][i] >= m_knot[0][i+1] )
    return false;
  j = span_index1+m_order[1]-2;
  if ( m_knot[1][j] >= m_knot[1][j+1] )
    return false;
  {
    ON_NurbsSurface bispan;
    bispan.m_cv = bezier_surface.m_cv;
    bispan.m_cv_capacity = bezier_surface.m_cv_capacity;
    bispan.Create( m_dim, m_is_rat, m_order[0], m_order[1], m_order[0], m_order[1] );
    const int sizeof_cv = CVSize()*sizeof(*bispan.m_cv);
    for ( i = 0; i < m_order[0]; i++ ) for ( j = 0; j < m_order[1]; j++ )
    {
      memcpy( bispan.CV(i,j), CV(span_index0+i,span_index1+j), sizeof_cv ); 
    }
    i = span_index0+m_order[0]-2;
    j = span_index1+m_order[1]-2;
    bool bClamp = false;
    if ( m_knot[0][span_index0] != m_knot[0][span_index0+m_order[0]-2] )
      bClamp = true;
    if ( m_knot[0][span_index0+m_order[0]-1] != m_knot[0][span_index0+2*m_order[0]-3] )
      bClamp = true;
    if ( m_knot[1][span_index1] != m_knot[1][span_index1+m_order[1]-2] )
      bClamp = true;
    if ( m_knot[1][span_index1+m_order[1]-1] != m_knot[1][span_index1+2*m_order[1]-3] )
      bClamp = true;
    if ( bClamp )
    {
      memcpy( bispan.m_knot[0], m_knot[0]+span_index0, bispan.KnotCount(0)*sizeof(bispan.m_knot[0][0]) );
      memcpy( bispan.m_knot[1], m_knot[1]+span_index1, bispan.KnotCount(1)*sizeof(bispan.m_knot[1][0]) );
      bispan.ClampEnd(1,2);
      bispan.ClampEnd(0,2);
    }
    bezier_surface.m_dim = bispan.m_dim;
    bezier_surface.m_is_rat = bispan.m_is_rat;
    bezier_surface.m_order[0] = bispan.m_order[0];
    bezier_surface.m_order[1] = bispan.m_order[1];
    bezier_surface.m_cv_stride[0] = bispan.m_cv_stride[0];
    bezier_surface.m_cv_stride[1] = bispan.m_cv_stride[1];
    bezier_surface.m_cv = bispan.m_cv;
    bezier_surface.m_cv_capacity = bispan.m_cv_capacity;
    bispan.m_cv = 0;
    bispan.m_cv_capacity = 0;
  }
  return true;
}